

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tb.cc
# Opt level: O2

void __thiscall
kratos::AssertValueStmt::AssertValueStmt(AssertValueStmt *this,shared_ptr<kratos::Var> *expr)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  int iVar2;
  VarException *this_00;
  initializer_list<const_kratos::IRNode_*> __l;
  string local_70;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_50;
  element_type *local_38;
  allocator<char> local_2a;
  allocator_type local_29;
  
  AssertBase::AssertBase(&this->super_AssertBase);
  (this->super_AssertBase).super_Stmt.super_IRNode._vptr_IRNode = (_func_int **)&PTR_accept_002b79d8
  ;
  (this->assert_var_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (expr->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (this->assert_var_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (expr->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (expr->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->assert_var_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = p_Var1;
  (expr->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)0x0;
  (this->else_stmt_).super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->else_stmt_).super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  iVar2 = (*(((this->assert_var_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             )->super_IRNode)._vptr_IRNode[7])();
  if (iVar2 == 1) {
    return;
  }
  this_00 = (VarException *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"Assert variable has to be width 1",&local_2a);
  local_38 = (this->assert_var_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  __l._M_len = 1;
  __l._M_array = (iterator)&local_38;
  std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
            (&local_50,__l,&local_29);
  VarException::VarException(this_00,&local_70,&local_50);
  __cxa_throw(this_00,&VarException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

AssertValueStmt::AssertValueStmt(std::shared_ptr<Var> expr) : assert_var_(std::move(expr)) {
    // making sure that the expression has to be width 1
    if (assert_var_->width() != 1)
        throw VarException("Assert variable has to be width 1", {assert_var_.get()});
}